

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O0

void __thiscall FRandom::GenRandAll(FRandom *this)

{
  w128_t *local_28;
  w128_t *r2;
  w128_t *r1;
  int i;
  FRandom *this_local;
  
  r2 = (this->sfmt).w128 + 3;
  local_28 = (this->sfmt).w128 + 4;
  for (r1._4_4_ = 0; r1._4_4_ < 3; r1._4_4_ = r1._4_4_ + 1) {
    do_recursion((w128_t *)((long)&this->sfmt + (long)r1._4_4_ * 0x10),
                 (w128_t *)((long)&this->sfmt + (long)r1._4_4_ * 0x10),
                 (w128_t *)((long)&this->sfmt + (long)(r1._4_4_ + 2) * 0x10),r2,local_28);
    r2 = local_28;
    local_28 = (w128_t *)((long)&this->sfmt + (long)r1._4_4_ * 0x10);
  }
  for (; r1._4_4_ < 5; r1._4_4_ = r1._4_4_ + 1) {
    do_recursion((w128_t *)((long)&this->sfmt + (long)r1._4_4_ * 0x10),
                 (w128_t *)((long)&this->sfmt + (long)r1._4_4_ * 0x10),
                 (w128_t *)((long)&this->sfmt + (long)(r1._4_4_ + -3) * 0x10),r2,local_28);
    r2 = local_28;
    local_28 = (w128_t *)((long)&this->sfmt + (long)r1._4_4_ * 0x10);
  }
  return;
}

Assistant:

void FRandom::GenRandAll()
{
	int i;
	w128_t *r1, *r2;

	r1 = &sfmt.w128[SFMT::N - 2];
	r2 = &sfmt.w128[SFMT::N - 1];
	for (i = 0; i < SFMT::N - POS1; i++) {
		do_recursion(&sfmt.w128[i], &sfmt.w128[i], &sfmt.w128[i + POS1], r1, r2);
		r1 = r2;
		r2 = &sfmt.w128[i];
	}
	for (; i < SFMT::N; i++) {
		do_recursion(&sfmt.w128[i], &sfmt.w128[i], &sfmt.w128[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &sfmt.w128[i];
	}
}